

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O1

Gia_Man_t *
Acb_NtkToGia(Acb_Ntk_t *p,Vec_Int_t *vSupp,Vec_Int_t *vNodes,Vec_Int_t *vRoots,Vec_Int_t *vDivs,
            Vec_Int_t *vTargets)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  Gia_Obj_t *pGVar5;
  int iVar6;
  Gia_Man_t *p_00;
  char *pcVar7;
  size_t sVar8;
  char *__dest;
  int *piVar9;
  Gia_Obj_t *pGVar10;
  Vec_Int_t *vTemp;
  Gia_Man_t *pGVar11;
  long lVar12;
  long lVar13;
  
  p_00 = Gia_ManStart((p->vObjType).nSize * 2 + 0x3e6);
  pcVar7 = Abc_NamStr(p->pDesign->pStrs,p->NameId);
  if (pcVar7 == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar7);
    __dest = (char *)malloc(sVar8 + 1);
    strcpy(__dest,pcVar7);
  }
  p_00->pName = __dest;
  Gia_ManHashAlloc(p_00);
  uVar1 = (p->vObjType).nCap;
  if ((p->vObjCopy).nCap < (int)uVar1) {
    piVar9 = (p->vObjCopy).pArray;
    if (piVar9 == (int *)0x0) {
      piVar9 = (int *)malloc((long)(int)uVar1 << 2);
    }
    else {
      piVar9 = (int *)realloc(piVar9,(long)(int)uVar1 << 2);
    }
    (p->vObjCopy).pArray = piVar9;
    if (piVar9 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vObjCopy).nCap = uVar1;
  }
  if (0 < (int)uVar1) {
    memset((p->vObjCopy).pArray,0xff,(ulong)uVar1 * 4);
  }
  (p->vObjCopy).nSize = uVar1;
  if (0 < vSupp->nSize) {
    lVar13 = 0;
    do {
      iVar2 = vSupp->pArray[lVar13];
      if (((long)iVar2 < 0) || ((p->vCis).nSize <= iVar2)) goto LAB_0039314f;
      uVar1 = (p->vCis).pArray[iVar2];
      pGVar10 = Gia_ManAppendObj(p_00);
      uVar4 = *(ulong *)pGVar10;
      *(ulong *)pGVar10 = uVar4 | 0x9fffffff;
      *(ulong *)pGVar10 =
           uVar4 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar5 = p_00->pObjs;
      if ((pGVar10 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar10)) goto LAB_0039316e;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar10 - (long)pGVar5) >> 2) * -0x55555555);
      pGVar5 = p_00->pObjs;
      if ((pGVar10 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar10)) goto LAB_0039316e;
      if ((int)uVar1 < 1) goto LAB_00393196;
      iVar2 = (p->vObjCopy).nSize;
      if (iVar2 < 1) goto LAB_0039318d;
      if (iVar2 <= (int)uVar1) goto LAB_0039314f;
      piVar9 = (p->vObjCopy).pArray;
      if (piVar9[uVar1] != -1) goto LAB_003931b5;
      piVar9[uVar1] = (int)((ulong)((long)pGVar10 - (long)pGVar5) >> 2) * 0x55555556;
      lVar13 = lVar13 + 1;
    } while (lVar13 < vSupp->nSize);
  }
  if ((vTargets != (Vec_Int_t *)0x0) && (0 < vTargets->nSize)) {
    lVar13 = 0;
    do {
      uVar1 = vTargets->pArray[lVar13];
      pGVar10 = Gia_ManAppendObj(p_00);
      uVar4 = *(ulong *)pGVar10;
      *(ulong *)pGVar10 = uVar4 | 0x9fffffff;
      *(ulong *)pGVar10 =
           uVar4 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar5 = p_00->pObjs;
      if ((pGVar10 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar10)) {
LAB_0039316e:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar10 - (long)pGVar5) >> 2) * -0x55555555);
      pGVar5 = p_00->pObjs;
      if ((pGVar10 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar10)) goto LAB_0039316e;
      if ((int)uVar1 < 1) goto LAB_00393196;
      iVar2 = (p->vObjCopy).nSize;
      if (iVar2 < 1) goto LAB_0039318d;
      if (iVar2 <= (int)uVar1) goto LAB_0039314f;
      piVar9 = (p->vObjCopy).pArray;
      if (piVar9[uVar1] != -1) goto LAB_003931b5;
      piVar9[uVar1] = (int)((ulong)((long)pGVar10 - (long)pGVar5) >> 2) * 0x55555556;
      lVar13 = lVar13 + 1;
    } while (lVar13 < vTargets->nSize);
  }
  vTemp = (Vec_Int_t *)malloc(0x10);
  vTemp->nCap = 0x10;
  vTemp->nSize = 0;
  piVar9 = (int *)malloc(0x40);
  vTemp->pArray = piVar9;
  if (0 < vNodes->nSize) {
    lVar13 = 0;
    do {
      iVar2 = vNodes->pArray[lVar13];
      lVar12 = (long)iVar2;
      if (lVar12 < 1) goto LAB_00393196;
      iVar3 = (p->vObjCopy).nSize;
      if (iVar3 < 1) goto LAB_0039318d;
      if (iVar3 <= iVar2) goto LAB_0039314f;
      if ((p->vObjCopy).pArray[lVar12] == -1) {
        iVar6 = Acb_ObjToGia(p_00,p,iVar2,vTemp);
        iVar3 = (p->vObjCopy).nSize;
        if (iVar3 < 1) goto LAB_0039318d;
        if (iVar3 <= iVar2) goto LAB_0039314f;
        piVar9 = (p->vObjCopy).pArray;
        if (piVar9[lVar12] != -1) {
LAB_003931b5:
          __assert_fail("Acb_ObjCopy(p, i) == -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                        ,0x11a,"void Acb_ObjSetCopy(Acb_Ntk_t *, int, int)");
        }
        piVar9[lVar12] = iVar6;
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < vNodes->nSize);
  }
  if (vTemp->pArray != (int *)0x0) {
    free(vTemp->pArray);
    vTemp->pArray = (int *)0x0;
  }
  free(vTemp);
  if (0 < vRoots->nSize) {
    lVar13 = 0;
    do {
      iVar2 = vRoots->pArray[lVar13];
      if (((long)iVar2 < 0) || ((p->vCos).nSize <= iVar2)) goto LAB_0039314f;
      iVar2 = (p->vCos).pArray[iVar2];
      if ((long)iVar2 < 1) {
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                      ,0xfe,"int Acb_ObjFanOffset(Acb_Ntk_t *, int)");
      }
      if ((p->vObjFans).nSize <= iVar2) goto LAB_0039314f;
      iVar2 = (p->vObjFans).pArray[iVar2];
      if (((long)iVar2 < 0) || ((p->vFanSto).nSize <= iVar2)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      iVar2 = (p->vFanSto).pArray[(long)iVar2 + 1];
      if ((long)iVar2 < 1) goto LAB_00393196;
      iVar3 = (p->vObjCopy).nSize;
      if (iVar3 < 1) goto LAB_0039318d;
      if (iVar3 <= iVar2) goto LAB_0039314f;
      Gia_ManAppendCo(p_00,(p->vObjCopy).pArray[iVar2]);
      lVar13 = lVar13 + 1;
    } while (lVar13 < vRoots->nSize);
  }
  if ((vDivs != (Vec_Int_t *)0x0) && (0 < vDivs->nSize)) {
    lVar13 = 0;
    do {
      iVar2 = vDivs->pArray[lVar13];
      if ((long)iVar2 < 1) goto LAB_00393196;
      iVar3 = (p->vObjCopy).nSize;
      if (iVar3 < 1) goto LAB_0039318d;
      if (iVar3 <= iVar2) {
LAB_0039314f:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      Gia_ManAppendCo(p_00,(p->vObjCopy).pArray[iVar2]);
      lVar13 = lVar13 + 1;
    } while (lVar13 < vDivs->nSize);
  }
  Gia_ManHashStop(p_00);
  pGVar11 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar11;
LAB_00393196:
  pcVar7 = "i>0";
  goto LAB_0039319d;
LAB_0039318d:
  pcVar7 = "Acb_NtkHasObjCopies(p)";
LAB_0039319d:
  __assert_fail(pcVar7,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                ,0x108,"int Acb_ObjCopy(Acb_Ntk_t *, int)");
}

Assistant:

Gia_Man_t * Acb_NtkToGia( Acb_Ntk_t * p, Vec_Int_t * vSupp, Vec_Int_t * vNodes, Vec_Int_t * vRoots, Vec_Int_t * vDivs, Vec_Int_t * vTargets )
{
    Gia_Man_t * pNew, * pOne;
    Vec_Int_t * vFanins;
    int i, iObj;
    pNew = Gia_ManStart( 2 * Acb_NtkObjNum(p) + 1000 );
    pNew->pName = Abc_UtilStrsav(Acb_NtkName(p));
    Gia_ManHashAlloc( pNew );
    Acb_NtkCleanObjCopies( p );
    // create primary inputs
    Acb_NtkForEachCiVec( vSupp, p, iObj, i )
        Acb_ObjSetCopy( p, iObj, Gia_ManAppendCi(pNew) );
    // add targets as primary inputs
    if ( vTargets )
        Vec_IntForEachEntry( vTargets, iObj, i )
            Acb_ObjSetCopy( p, iObj, Gia_ManAppendCi(pNew) );
    // bit-blast internal nodes
    vFanins = Vec_IntAlloc( 4 );
    Vec_IntForEachEntry( vNodes, iObj, i )
        if ( Acb_ObjCopy(p, iObj) == -1 ) // skip targets assigned above
            Acb_ObjSetCopy( p, iObj, Acb_ObjToGia(pNew, p, iObj, vFanins) );
    Vec_IntFree( vFanins );
    // create primary outputs
    Acb_NtkForEachCoDriverVec( vRoots, p, iObj, i )
        Gia_ManAppendCo( pNew, Acb_ObjCopy(p, iObj) );
    // add divisor as primary outputs (if the divisors are not primary inputs)
    if ( vDivs )//&& Vec_IntSize(vDivs) > Vec_IntSize(vSupp) ) 
        Vec_IntForEachEntry( vDivs, iObj, i )
            Gia_ManAppendCo( pNew, Acb_ObjCopy(p, iObj) );
    Gia_ManHashStop( pNew );
    pNew = Gia_ManCleanup( pOne = pNew );
    Gia_ManStop( pOne );
    return pNew;
}